

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bossac.cpp
# Opt level: O3

void __thiscall BossaObserver::onProgress(BossaObserver *this,int num,int div)

{
  uint uVar1;
  undefined4 in_register_00000034;
  uint uVar2;
  
  uVar1 = (num * 0x1e) / div;
  if (uVar1 == this->_lastTicks) {
    return;
  }
  printf("\r[",CONCAT44(in_register_00000034,num),(long)(num * 0x1e) % (long)div & 0xffffffff);
  if (0 < (int)uVar1) {
    uVar2 = uVar1 + 1;
    do {
      putchar(0x3d);
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
    if (0x1d < (int)uVar1) goto LAB_0010598a;
  }
  uVar1 = (((int)uVar1 >> 0x1f & uVar1) - uVar1) + 0x1f;
  do {
    putchar(0x20);
    uVar1 = uVar1 - 1;
  } while (1 < uVar1);
LAB_0010598a:
  printf("] %d%% (%d/%d pages)",(long)(num * 100) / (long)div & 0xffffffff,(ulong)(uint)num,
         (ulong)(uint)div);
  fflush(_stdout);
  this->_lastTicks = 0;
  return;
}

Assistant:

void
BossaObserver::onProgress(int num, int div)
{
    int ticks;
    int bars = 30;

    ticks = num * bars / div;
    
    if (ticks == _lastTicks)
        return;
    
    printf("\r[");
    while (ticks-- > 0)
    {
        putchar('=');
        bars--;
    }
    while (bars-- > 0)
    {
        putchar(' ');
    }
    printf("] %d%% (%d/%d pages)", num * 100 / div, num, div);
    fflush(stdout);
    
    _lastTicks = 0;
}